

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

bool __thiscall google::protobuf::MapKey::operator==(MapKey *this,MapKey *other)

{
  size_t __n;
  CppType CVar1;
  int iVar2;
  bool bVar3;
  LogMessageFatal local_20 [16];
  
  if (this->type_ != other->type_) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map_field.h"
               ,0xb1);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_20,(char (*) [27])"Unsupported: type mismatch");
    goto LAB_002e62ea;
  }
  CVar1 = type(this);
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    bVar3 = (this->val_).int32_value == (other->val_).int32_value;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    bVar3 = (this->val_).int64_value == (other->val_).int64_value;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map_field.h"
               ,0xb8);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_20,(char (*) [12])"Unsupported");
    goto LAB_002e62ea;
  case CPPTYPE_BOOL:
    bVar3 = (this->val_).bool_value == (other->val_).bool_value;
    break;
  case CPPTYPE_STRING:
    __n = *(size_t *)((long)&this->val_ + 8);
    if (__n == *(size_t *)((long)&other->val_ + 8)) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((void *)(this->val_).int64_value,(void *)(other->val_).int64_value,__n);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map_field.h"
               ,199);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_20,(char (*) [16])"Can\'t get here.");
LAB_002e62ea:
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
  }
  return bVar3;
}

Assistant:

bool operator==(const MapKey& other) const {
    if (type_ != other.type_) {
      // To be consistent with operator<, we don't allow this either.
      ABSL_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        ABSL_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        return val_.string_value.get() == other.val_.string_value.get();
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value == other.val_.int64_value;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value == other.val_.int32_value;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value == other.val_.uint64_value;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value == other.val_.uint32_value;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value == other.val_.bool_value;
    }
    ABSL_LOG(FATAL) << "Can't get here.";
    return false;
  }